

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_sse2.c
# Opt level: O2

void subtract_average_sse2
               (uint16_t *src_ptr,int16_t *dst_ptr,int width,int height,int round_offset,
               int num_pel_log2)

{
  short *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  uint16_t *puVar25;
  long lVar26;
  uint16_t *puVar27;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  undefined1 auVar28 [16];
  short sVar35;
  int iVar36;
  int iVar38;
  ulong uVar37;
  int iVar39;
  int iVar40;
  ushort uVar41;
  short sVar42;
  ushort uVar43;
  
  puVar25 = src_ptr + (ulong)(uint)(height << 2) * 8;
  lVar26 = 0x10;
  if (width == 8) {
    lVar26 = 0x40;
  }
  iVar36 = 0;
  iVar38 = 0;
  iVar39 = 0;
  iVar40 = 0;
  puVar27 = src_ptr;
  do {
    if (width == 4) {
      uVar2 = *(undefined8 *)puVar27;
      uVar3 = *(undefined8 *)(puVar27 + 0x20);
      uVar41 = (short)((ulong)uVar3 >> 0x30) + (short)((ulong)uVar2 >> 0x30);
      uVar4 = *(undefined8 *)(puVar27 + 0x40);
      uVar5 = *(undefined8 *)(puVar27 + 0x60);
      uVar43 = (short)((ulong)uVar5 >> 0x30) + (short)((ulong)uVar4 >> 0x30);
      auVar6._12_2_ = uVar41;
      auVar6._0_12_ = ZEXT212(uVar41) << 0x30;
      uVar21 = CONCAT44(auVar6._10_4_,
                        CONCAT22((short)((ulong)uVar3 >> 0x20) + (short)((ulong)uVar2 >> 0x20),
                                 uVar41));
      auVar17._6_8_ = 0;
      auVar17._0_6_ = (uint6)((ulong)uVar21 >> 0x10);
      auVar7._12_2_ = uVar43;
      auVar7._0_12_ = ZEXT212(uVar43) << 0x30;
      uVar22 = CONCAT44(auVar7._10_4_,
                        CONCAT22((short)((ulong)uVar5 >> 0x20) + (short)((ulong)uVar4 >> 0x20),
                                 uVar43));
      auVar18._6_8_ = 0;
      auVar18._0_6_ = (uint6)((ulong)uVar22 >> 0x10);
      iVar36 = iVar36 + (uint)(ushort)((short)uVar3 + (short)uVar2) +
               (uint)(ushort)((short)uVar5 + (short)uVar4);
      iVar38 = iVar38 + (int)CONCAT82(SUB148(auVar17 << 0x40,6),
                                      (short)((ulong)uVar3 >> 0x10) + (short)((ulong)uVar2 >> 0x10))
               + (int)CONCAT82(SUB148(auVar18 << 0x40,6),
                               (short)((ulong)uVar5 >> 0x10) + (short)((ulong)uVar4 >> 0x10));
      iVar39 = iVar39 + (int)((ulong)uVar21 >> 0x10) + (int)((ulong)uVar22 >> 0x10);
      iVar40 = iVar40 + (auVar6._10_4_ >> 0x10) + (auVar7._10_4_ >> 0x10);
    }
    else {
      psVar1 = (short *)((long)puVar27 + lVar26);
      sVar42 = psVar1[3] + puVar27[3];
      auVar23._2_2_ = psVar1[4] + puVar27[4];
      auVar23._0_2_ = sVar42;
      auVar23._4_8_ = 0;
      auVar8._12_2_ = sVar42;
      auVar8._0_12_ = auVar23 << 0x30;
      uVar2 = CONCAT44(auVar8._10_4_,CONCAT22(psVar1[2] + puVar27[2],sVar42));
      auVar19._6_8_ = 0;
      auVar19._0_6_ = (uint6)((ulong)uVar2 >> 0x10);
      iVar36 = iVar36 + (uint)(ushort)(psVar1[4] + puVar27[4]) + (uint)(ushort)(*psVar1 + *puVar27);
      iVar38 = iVar38 + (uint)(ushort)(psVar1[5] + puVar27[5]) +
               (int)CONCAT82(SUB148(auVar19 << 0x40,6),psVar1[1] + puVar27[1]);
      iVar39 = iVar39 + (uint)(ushort)(psVar1[6] + puVar27[6]) + (int)((ulong)uVar2 >> 0x10);
      iVar40 = iVar40 + (uint)(ushort)(psVar1[7] + puVar27[7]) + (auVar8._10_4_ >> 0x10);
      if (width == 0x20) {
        sVar42 = puVar27[0x1b] + puVar27[0x13];
        auVar24._2_2_ = puVar27[0x1c] + puVar27[0x14];
        auVar24._0_2_ = sVar42;
        auVar24._4_8_ = 0;
        auVar9._12_2_ = sVar42;
        auVar9._0_12_ = auVar24 << 0x30;
        uVar2 = CONCAT44(auVar9._10_4_,CONCAT22(puVar27[0x1a] + puVar27[0x12],sVar42));
        auVar20._6_8_ = 0;
        auVar20._0_6_ = (uint6)((ulong)uVar2 >> 0x10);
        iVar36 = iVar36 + (uint)(ushort)(puVar27[0x1c] + puVar27[0x14]) +
                          (uint)(ushort)(puVar27[0x18] + puVar27[0x10]);
        iVar38 = iVar38 + (uint)(ushort)(puVar27[0x1d] + puVar27[0x15]) +
                          (int)CONCAT82(SUB148(auVar20 << 0x40,6),puVar27[0x19] + puVar27[0x11]);
        iVar39 = iVar39 + (uint)(ushort)(puVar27[0x1e] + puVar27[0x16]) +
                          (int)((ulong)uVar2 >> 0x10);
        iVar40 = iVar40 + (uint)(ushort)(puVar27[0x1f] + puVar27[0x17]) + (auVar9._10_4_ >> 0x10);
      }
    }
    puVar27 = (uint16_t *)
              ((long)puVar27 + (ulong)(((uint)(width == 8) + (uint)(width == 4) * 3) * 0x40 + 0x40))
    ;
  } while (puVar27 < puVar25);
  uVar37 = (ulong)(uint)num_pel_log2;
  auVar28._0_4_ = (uint)(iVar39 + iVar36 + round_offset + iVar40 + iVar38) >> uVar37;
  auVar28._4_4_ = (uint)(iVar40 + iVar38 + round_offset + iVar39 + iVar36) >> uVar37;
  auVar28._8_4_ = (uint)(iVar36 + iVar39 + round_offset + iVar38 + iVar40) >> uVar37;
  auVar28._12_4_ = (uint)(iVar38 + iVar40 + round_offset + iVar36 + iVar39) >> uVar37;
  auVar28 = packssdw(auVar28,auVar28);
  do {
    sVar42 = auVar28._0_2_;
    sVar29 = auVar28._2_2_;
    sVar30 = auVar28._4_2_;
    sVar31 = auVar28._6_2_;
    sVar32 = auVar28._8_2_;
    sVar33 = auVar28._10_2_;
    sVar34 = auVar28._12_2_;
    sVar35 = auVar28._14_2_;
    if (width == 4) {
      uVar2 = *(undefined8 *)src_ptr;
      *(ulong *)dst_ptr =
           CONCAT26((short)((ulong)uVar2 >> 0x30) - sVar31,
                    CONCAT24((short)((ulong)uVar2 >> 0x20) - sVar30,
                             CONCAT22((short)((ulong)uVar2 >> 0x10) - sVar29,(short)uVar2 - sVar42))
                   );
    }
    else {
      uVar10 = src_ptr[1];
      uVar11 = src_ptr[2];
      uVar12 = src_ptr[3];
      uVar13 = src_ptr[4];
      uVar14 = src_ptr[5];
      uVar15 = src_ptr[6];
      uVar16 = src_ptr[7];
      *dst_ptr = *src_ptr - sVar42;
      dst_ptr[1] = uVar10 - sVar29;
      dst_ptr[2] = uVar11 - sVar30;
      dst_ptr[3] = uVar12 - sVar31;
      dst_ptr[4] = uVar13 - sVar32;
      dst_ptr[5] = uVar14 - sVar33;
      dst_ptr[6] = uVar15 - sVar34;
      dst_ptr[7] = uVar16 - sVar35;
      if (8 < width) {
        uVar10 = src_ptr[9];
        uVar11 = src_ptr[10];
        uVar12 = src_ptr[0xb];
        uVar13 = src_ptr[0xc];
        uVar14 = src_ptr[0xd];
        uVar15 = src_ptr[0xe];
        uVar16 = src_ptr[0xf];
        dst_ptr[8] = src_ptr[8] - sVar42;
        dst_ptr[9] = uVar10 - sVar29;
        dst_ptr[10] = uVar11 - sVar30;
        dst_ptr[0xb] = uVar12 - sVar31;
        dst_ptr[0xc] = uVar13 - sVar32;
        dst_ptr[0xd] = uVar14 - sVar33;
        dst_ptr[0xe] = uVar15 - sVar34;
        dst_ptr[0xf] = uVar16 - sVar35;
        if (width == 0x20) {
          uVar10 = src_ptr[0x11];
          uVar11 = src_ptr[0x12];
          uVar12 = src_ptr[0x13];
          uVar13 = src_ptr[0x14];
          uVar14 = src_ptr[0x15];
          uVar15 = src_ptr[0x16];
          uVar16 = src_ptr[0x17];
          dst_ptr[0x10] = src_ptr[0x10] - sVar42;
          dst_ptr[0x11] = uVar10 - sVar29;
          dst_ptr[0x12] = uVar11 - sVar30;
          dst_ptr[0x13] = uVar12 - sVar31;
          dst_ptr[0x14] = uVar13 - sVar32;
          dst_ptr[0x15] = uVar14 - sVar33;
          dst_ptr[0x16] = uVar15 - sVar34;
          dst_ptr[0x17] = uVar16 - sVar35;
          uVar10 = src_ptr[0x19];
          uVar11 = src_ptr[0x1a];
          uVar12 = src_ptr[0x1b];
          uVar13 = src_ptr[0x1c];
          uVar14 = src_ptr[0x1d];
          uVar15 = src_ptr[0x1e];
          uVar16 = src_ptr[0x1f];
          dst_ptr[0x18] = src_ptr[0x18] - sVar42;
          dst_ptr[0x19] = uVar10 - sVar29;
          dst_ptr[0x1a] = uVar11 - sVar30;
          dst_ptr[0x1b] = uVar12 - sVar31;
          dst_ptr[0x1c] = uVar13 - sVar32;
          dst_ptr[0x1d] = uVar14 - sVar33;
          dst_ptr[0x1e] = uVar15 - sVar34;
          dst_ptr[0x1f] = uVar16 - sVar35;
        }
      }
    }
    src_ptr = src_ptr + 0x20;
    dst_ptr = dst_ptr + 0x20;
  } while (src_ptr < puVar25);
  return;
}

Assistant:

static inline void subtract_average_sse2(const uint16_t *src_ptr,
                                         int16_t *dst_ptr, int width,
                                         int height, int round_offset,
                                         int num_pel_log2) {
  const __m128i zeros = _mm_setzero_si128();
  const __m128i round_offset_epi32 = _mm_set1_epi32(round_offset);
  const __m128i *src = (__m128i *)src_ptr;
  const __m128i *const end = src + height * CFL_BUF_LINE_I128;
  const int step = CFL_BUF_LINE_I128 * (1 + (width == 8) + 3 * (width == 4));

  __m128i sum = zeros;
  do {
    __m128i l0;
    if (width == 4) {
      l0 = _mm_add_epi16(_mm_loadl_epi64(src),
                         _mm_loadl_epi64(src + CFL_BUF_LINE_I128));
      __m128i l1 = _mm_add_epi16(_mm_loadl_epi64(src + 2 * CFL_BUF_LINE_I128),
                                 _mm_loadl_epi64(src + 3 * CFL_BUF_LINE_I128));
      sum = _mm_add_epi32(sum, _mm_add_epi32(_mm_unpacklo_epi16(l0, zeros),
                                             _mm_unpacklo_epi16(l1, zeros)));
    } else {
      if (width == 8) {
        l0 = _mm_add_epi16(_mm_loadu_si128(src),
                           _mm_loadu_si128(src + CFL_BUF_LINE_I128));
      } else {
        l0 = _mm_add_epi16(_mm_loadu_si128(src), _mm_loadu_si128(src + 1));
      }
      sum = _mm_add_epi32(sum, _mm_add_epi32(_mm_unpacklo_epi16(l0, zeros),
                                             _mm_unpackhi_epi16(l0, zeros)));
      if (width == 32) {
        l0 = _mm_add_epi16(_mm_loadu_si128(src + 2), _mm_loadu_si128(src + 3));
        sum = _mm_add_epi32(sum, _mm_add_epi32(_mm_unpacklo_epi16(l0, zeros),
                                               _mm_unpackhi_epi16(l0, zeros)));
      }
    }
    src += step;
  } while (src < end);

  sum = fill_sum_epi32(sum);

  __m128i avg_epi16 =
      _mm_srli_epi32(_mm_add_epi32(sum, round_offset_epi32), num_pel_log2);
  avg_epi16 = _mm_packs_epi32(avg_epi16, avg_epi16);

  src = (__m128i *)src_ptr;
  __m128i *dst = (__m128i *)dst_ptr;
  do {
    if (width == 4) {
      _mm_storel_epi64(dst, _mm_sub_epi16(_mm_loadl_epi64(src), avg_epi16));
    } else {
      _mm_storeu_si128(dst, _mm_sub_epi16(_mm_loadu_si128(src), avg_epi16));
      if (width > 8) {
        _mm_storeu_si128(dst + 1,
                         _mm_sub_epi16(_mm_loadu_si128(src + 1), avg_epi16));
        if (width == 32) {
          _mm_storeu_si128(dst + 2,
                           _mm_sub_epi16(_mm_loadu_si128(src + 2), avg_epi16));
          _mm_storeu_si128(dst + 3,
                           _mm_sub_epi16(_mm_loadu_si128(src + 3), avg_epi16));
        }
      }
    }
    src += CFL_BUF_LINE_I128;
    dst += CFL_BUF_LINE_I128;
  } while (src < end);
}